

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void __thiscall
disruptor::test::SleepingStrategy::WaitForDependents::test_method(WaitForDependents *this)

{
  atomic<long> *paVar1;
  atomic<long> return_value;
  __atomic_base<long> local_120;
  thread waiter;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_110 = (undefined **)operator_new(0x18);
  *local_110 = (undefined *)&PTR___State_00119a38;
  local_110[1] = (undefined *)this;
  local_110[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_110,0);
  if (local_110 != (undefined **)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).cursor.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x12a);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00119cf8;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_58 = "";
  local_120 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_110,&local_60,0x12a,1,2,&local_120,"return_value.load()",&kInitialCursorValue,
             "kInitialCursorValue");
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x12d);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00119cf8;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_88 = "";
  local_120 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_110,&local_90,0x12d,1,2,&local_120,"return_value.load()",&kInitialCursorValue,
             "kInitialCursorValue");
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_2.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x130);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00119cf8;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_b8 = "";
  local_120 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_110,&local_c0,0x130,1,2,&local_120,"return_value.load()",&kInitialCursorValue,
             "kInitialCursorValue");
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_3.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  std::thread::join();
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x134);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00119cf8;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_e8 = "";
  local_120 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_110,&local_f0,0x134,1,2,&local_120,"return_value.load()",&kFirstSequenceValue,
             "kFirstSequenceValue");
  std::thread::~thread(&waiter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}